

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O0

FT_Error T42_Size_Select(FT_Size t42size,FT_ULong strike_index)

{
  FT_Face pFVar1;
  FT_Error FVar2;
  FT_Error error;
  T42_Face face;
  T42_Size size;
  FT_ULong strike_index_local;
  FT_Size t42size_local;
  
  pFVar1 = t42size->face;
  FT_Activate_Size((FT_Size)t42size[1].face);
  FVar2 = FT_Select_Size((FT_Face)pFVar1[3].available_sizes,(FT_Int)strike_index);
  if (FVar2 == 0) {
    memcpy(&t42size->metrics,(void *)(*(long *)(pFVar1[3].available_sizes + 5) + 0x18),0x38);
  }
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Size_Select( FT_Size   t42size,         /* T42_Size */
                   FT_ULong  strike_index )
  {
    T42_Size  size = (T42_Size)t42size;
    T42_Face  face = (T42_Face)t42size->face;
    FT_Error  error;


    FT_Activate_Size( size->ttsize );

    error = FT_Select_Size( face->ttf_face, (FT_Int)strike_index );
    if ( !error )
      t42size->metrics = face->ttf_face->size->metrics;

    return error;

  }